

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::ParseDynamicSymbolTable(LoadCommand *cmd,RangeSink *sink)

{
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  string_view data_03;
  string_view data_04;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  long in_RDI;
  string_view sVar1;
  dysymtab_command *dysymtab;
  size_t in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  basic_string_view<char,_std::char_traits<char>_> *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffea0;
  basic_string_view<char,_std::char_traits<char>_> *this;
  size_t in_stack_fffffffffffffea8;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  char *in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffec8 [16];
  string_view in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee8;
  size_t sVar3;
  char *in_stack_fffffffffffffef0;
  char *pcVar4;
  
  sVar1._M_str = in_stack_fffffffffffffe90;
  sVar1._M_len = in_stack_fffffffffffffe88;
  GetStructPointer<dysymtab_command>(sVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  data._M_str = in_stack_fffffffffffffeb0;
  data._M_len = in_stack_fffffffffffffea8;
  StrictSubstr(data,(size_t)in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
  name._M_str = in_stack_fffffffffffffef0;
  name._M_len = in_stack_fffffffffffffee8;
  RangeSink::AddFileRange
            (in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._0_8_,name,
             in_stack_fffffffffffffed8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  data_00._M_str = in_stack_fffffffffffffeb0;
  data_00._M_len = in_stack_fffffffffffffea8;
  StrictSubstr(data_00,(size_t)in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
  name_00._M_str = in_stack_fffffffffffffef0;
  name_00._M_len = in_stack_fffffffffffffee8;
  RangeSink::AddFileRange
            (in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._0_8_,name_00,
             in_stack_fffffffffffffed8);
  __str = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffea0,(char *)in_RSI);
  data_01._M_str = in_stack_fffffffffffffeb0;
  data_01._M_len = in_stack_fffffffffffffea8;
  StrictSubstr(data_01,(size_t)in_stack_fffffffffffffea0,(size_t)__str);
  name_01._M_str = in_stack_fffffffffffffef0;
  name_01._M_len = in_stack_fffffffffffffee8;
  RangeSink::AddFileRange
            (in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._0_8_,name_01,
             in_stack_fffffffffffffed8);
  this = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RSI,(char *)__str);
  data_02._M_str = in_stack_fffffffffffffeb0;
  data_02._M_len = in_stack_fffffffffffffea8;
  StrictSubstr(data_02,(size_t)this,(size_t)__str);
  name_02._M_str = in_stack_fffffffffffffef0;
  name_02._M_len = in_stack_fffffffffffffee8;
  RangeSink::AddFileRange
            (in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._0_8_,name_02,
             in_stack_fffffffffffffed8);
  pbVar2 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this,(char *)__str);
  sVar3 = *(size_t *)(in_RDI + 0x18);
  pcVar4 = *(char **)(in_RDI + 0x20);
  data_03._M_str = in_stack_fffffffffffffeb0;
  data_03._M_len = (size_t)pbVar2;
  StrictSubstr(data_03,(size_t)this,(size_t)__str);
  name_03._M_str = pcVar4;
  name_03._M_len = sVar3;
  RangeSink::AddFileRange
            (in_stack_fffffffffffffec8._8_8_,in_stack_fffffffffffffec8._0_8_,name_03,
             in_stack_fffffffffffffed8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this,(char *)__str);
  data_04._M_str = (char *)in_RSI;
  data_04._M_len = (size_t)pbVar2;
  sVar1 = StrictSubstr(data_04,(size_t)this,(size_t)__str);
  name_04._M_str = pcVar4;
  name_04._M_len = sVar3;
  RangeSink::AddFileRange
            ((RangeSink *)sVar1._M_str,(char *)sVar1._M_len,name_04,in_stack_fffffffffffffed8);
  return;
}

Assistant:

static void ParseDynamicSymbolTable(const LoadCommand& cmd, RangeSink* sink) {
  auto dysymtab = GetStructPointer<dysymtab_command>(cmd.command_data);

  sink->AddFileRange(
      "macho_dynsymtab", "Table of Contents",
      StrictSubstr(cmd.file_data, dysymtab->tocoff,
                   dysymtab->ntoc * sizeof(dylib_table_of_contents)));
  sink->AddFileRange("macho_dynsymtab", "Module Table",
                     StrictSubstr(cmd.file_data, dysymtab->modtaboff,
                                  dysymtab->nmodtab * sizeof(dylib_module_64)));
  sink->AddFileRange(
      "macho_dynsymtab", "Referenced Symbol Table",
      StrictSubstr(cmd.file_data, dysymtab->extrefsymoff,
                   dysymtab->nextrefsyms * sizeof(dylib_reference)));
  sink->AddFileRange("macho_dynsymtab", "Indirect Symbol Table",
                     StrictSubstr(cmd.file_data, dysymtab->indirectsymoff,
                                  dysymtab->nindirectsyms * sizeof(uint32_t)));
  sink->AddFileRange("macho_dynsymtab", "External Relocation Entries",
                     StrictSubstr(cmd.file_data, dysymtab->extreloff,
                                  dysymtab->nextrel * sizeof(relocation_info)));
  sink->AddFileRange(
      "macho_dynsymtab", "Local Relocation Entries",
      StrictSubstr(cmd.file_data, dysymtab->locreloff,
                   dysymtab->nlocrel * sizeof(struct relocation_info)));
}